

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsay.c
# Opt level: O2

void speak_stdin_console(OpenJTalk *openjtalk)

{
  bool bVar1;
  char *pcVar2;
  bool bVar3;
  char line [1001];
  char local_418 [1016];
  
  bVar1 = true;
  do {
    while( true ) {
      bVar3 = bVar1;
      pcVar2 = fgets(local_418,0x104,_stdin);
      if (pcVar2 == (char *)0x0) {
        return;
      }
      remove_cr_lf(local_418);
      if (local_418[0] == '\0') break;
      openjtalk_speakSync(openjtalk,local_418);
      bVar1 = bVar3;
    }
    bVar1 = false;
  } while (bVar3);
  return;
}

Assistant:

void speak_stdin_console(OpenJTalk *openjtalk)
{
	char line[MAX_LENGTH + 1];
	int empty = 0;

	while (fgets(line, MAX_PATH, stdin) != NULL)
	{
		remove_cr_lf(line);
		if (strlen(line) == 0)
		{
			empty++;
			if (empty == 2)
			{
				break;
			}
			continue;
		}
#if defined(_WIN32)
		openjtalk_speakSyncSjis(openjtalk, line);
#else
		openjtalk_speakSync(openjtalk, line);
#endif
	}
}